

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::BasicReporter::EndTesting(BasicReporter *this,Totals *totals)

{
  ostream *poVar1;
  string local_38;
  
  poVar1 = (this->m_config).stream;
  if (this->m_aborted == true) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n[Testing aborted. ",0x13);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"The first ","");
    ReportCounts(this,totals,&local_38);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n[Testing completed. ",0x15);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"All ","");
    ReportCounts(this,totals,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  poVar1 = (this->m_config).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]\n",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void EndTesting( const Totals& totals ) {
            // Output the overall test results even if "Started Testing" was not emitted
            if( m_aborted ) {
                m_config.stream << "\n[Testing aborted. ";
                ReportCounts( totals, "The first " );
            }
            else {
                m_config.stream << "\n[Testing completed. ";
                ReportCounts( totals );
            }
            m_config.stream << "]\n" << std::endl;
        }